

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTasks.cpp
# Opt level: O1

Expression * __thiscall
slang::ast::builtins::DumpVarsTask::bindArgument
          (DumpVarsTask *this,size_t argIndex,ASTContext *context,ExpressionSyntax *syntax,
          Args *args)

{
  SymbolKind SVar1;
  Scope *pSVar2;
  Compilation *this_00;
  pointer this_01;
  bool bVar3;
  uint uVar4;
  Compilation *compilation;
  Diagnostic *pDVar5;
  Diagnostic *pDVar6;
  Expression *pEVar7;
  char *func;
  bitmask<slang::ast::LookupFlags> extraLookupFlags;
  SourceRange sourceRange;
  Diagnostic *local_30;
  
  extraLookupFlags.m_bits = (underlying_type)args;
  if (argIndex == 0) {
    pEVar7 = SystemSubroutine::bindArgument((SystemSubroutine *)this,0,context,syntax,args);
    return pEVar7;
  }
  pSVar2 = (context->scope).ptr;
  if (pSVar2 != (Scope *)0x0) {
    this_00 = pSVar2->compilation;
    bVar3 = slang::syntax::NameSyntax::isKind((syntax->super_SyntaxNode).kind);
    if (!bVar3) {
      sourceRange = slang::syntax::SyntaxNode::sourceRange(&syntax->super_SyntaxNode);
      ASTContext::addDiag(context,(DiagCode)0xa000b,sourceRange);
      local_30 = (Diagnostic *)0x0;
      pDVar5 = (Diagnostic *)
               BumpAllocator::
               emplace<slang::ast::InvalidExpression,decltype(nullptr),slang::ast::Type_const&>
                         (&this_00->super_BumpAllocator,&local_30,this_00->errorType);
      return (Expression *)pDVar5;
    }
    compilation = (Compilation *)
                  slang::syntax::SyntaxNode::as<slang::syntax::NameSyntax>
                            (&syntax->super_SyntaxNode);
    pDVar5 = (Diagnostic *)
             HierarchicalReferenceExpression::fromSyntax
                       ((HierarchicalReferenceExpression *)this_00,compilation,(NameSyntax *)context
                        ,(ASTContext *)0x0,extraLookupFlags);
    if (*(ExpressionKind *)
         &(pDVar5->args).
          super__Vector_base<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>,_std::allocator<std::variant<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_unsigned_long,_char,_slang::ConstantValue,_std::any>_>_>
          ._M_impl.super__Vector_impl_data._M_start != HierarchicalReference) {
      return (Expression *)pDVar5;
    }
    this_01 = (pDVar5->notes).
              super__Vector_base<slang::Diagnostic,_std::allocator<slang::Diagnostic>_>._M_impl.
              super__Vector_impl_data._M_start;
    if (this_01 == (pointer)0x0) {
      func = 
      "T slang::not_null<const slang::ast::Symbol *>::get() const [T = const slang::ast::Symbol *]";
      goto LAB_003820b3;
    }
    SVar1 = (((InstanceSymbolBase *)&this_01->args)->super_Symbol).kind;
    if ((SVar1 - Net < 2) ||
       ((SVar1 == Instance && (bVar3 = InstanceSymbol::isModule((InstanceSymbol *)this_01), bVar3)))
       ) {
      bVar3 = true;
      uVar4 = (((InstanceSymbolBase *)&this_01->args)->super_Symbol).kind - Variable;
      pDVar6 = (Diagnostic *)(ulong)uVar4;
      if ((uVar4 < 0x19) &&
         (((0x1800c0fU >> (uVar4 & 0x1f) & 1) != 0 && (*(int *)((long)(this_01 + 1) + 0x18) == 0))))
      {
        pDVar6 = ASTContext::addDiag(context,(DiagCode)0x4000b,
                                     *(SourceRange *)
                                      &(pDVar5->ranges).
                                       super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                                       ._M_impl.super__Vector_impl_data._M_finish);
        pDVar6 = Diagnostic::operator<<
                           (pDVar6,(((InstanceSymbolBase *)&this_01->args)->super_Symbol).name);
      }
LAB_00382089:
      if (bVar3) {
        return (Expression *)pDVar5;
      }
      return (Expression *)pDVar6;
    }
    pSVar2 = (context->scope).ptr;
    if (pSVar2 != (Scope *)0x0) {
      bVar3 = Scope::isUninstantiated(pSVar2);
      if (!bVar3) {
        ASTContext::addDiag(context,(DiagCode)0xa000b,
                            *(SourceRange *)
                             &(pDVar5->ranges).
                              super__Vector_base<slang::SourceRange,_std::allocator<slang::SourceRange>_>
                              ._M_impl.super__Vector_impl_data._M_finish);
      }
      local_30 = pDVar5;
      pDVar6 = (Diagnostic *)
               BumpAllocator::
               emplace<slang::ast::InvalidExpression,slang::ast::Expression*,slang::ast::Type_const&>
                         (&this_00->super_BumpAllocator,(Expression **)&local_30,this_00->errorType)
      ;
      bVar3 = false;
      goto LAB_00382089;
    }
  }
  func = "T slang::not_null<const slang::ast::Scope *>::get() const [T = const slang::ast::Scope *]"
  ;
LAB_003820b3:
  assert::assertFailed
            ("ptr",
             "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
             ,0x26,func);
}

Assistant:

const Expression& bindArgument(size_t argIndex, const ASTContext& context,
                                   const ExpressionSyntax& syntax, const Args& args) const final {
        if (argIndex > 0) {
            auto& comp = context.getCompilation();
            if (!NameSyntax::isKind(syntax.kind)) {
                context.addDiag(diag::ExpectedModOrVarName, syntax.sourceRange());
                return *comp.emplace<InvalidExpression>(nullptr, comp.getErrorType());
            }

            auto& ref = HierarchicalReferenceExpression::fromSyntax(comp, syntax.as<NameSyntax>(),
                                                                    context);

            if (ref.kind == ExpressionKind::HierarchicalReference) {
                auto& sym = *ref.as<HierarchicalReferenceExpression>().symbol;
                if (sym.kind != SymbolKind::Variable && sym.kind != SymbolKind::Net &&
                    (sym.kind != SymbolKind::Instance || !sym.as<InstanceSymbol>().isModule())) {
                    if (!context.scope->isUninstantiated())
                        context.addDiag(diag::ExpectedModOrVarName, ref.sourceRange);
                    return *comp.emplace<InvalidExpression>(&ref, comp.getErrorType());
                }
                else if (VariableSymbol::isKind(sym.kind) &&
                         sym.as<VariableSymbol>().lifetime == VariableLifetime::Automatic) {
                    context.addDiag(diag::AutoVarTraced, ref.sourceRange) << sym.name;
                }
            }

            return ref;
        }

        return SystemTaskBase::bindArgument(argIndex, context, syntax, args);
    }